

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

bool Diligent::LinuxFileSystem::FileExists(Char *strFilePath)

{
  int iVar1;
  char *__file;
  undefined1 local_e0 [8];
  stat StatBuff;
  allocator local_39;
  undefined1 local_38 [8];
  string path;
  Char *strFilePath_local;
  
  path.field_2._8_8_ = strFilePath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,strFilePath,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  BasicFileSystem::CorrectSlashes((String *)local_38,'\0');
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_e0);
  if (iVar1 == 0) {
    strFilePath_local._7_1_ = (bool)((((uint)StatBuff.st_nlink & 0xf000) == 0x4000 ^ 0xffU) & 1);
  }
  else {
    strFilePath_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_38);
  return strFilePath_local._7_1_;
}

Assistant:

bool LinuxFileSystem::FileExists(const Char* strFilePath)
{
    std::string path{strFilePath};
    CorrectSlashes(path);

    struct stat StatBuff;
    if (stat(path.c_str(), &StatBuff) != 0)
        return false;

    return !S_ISDIR(StatBuff.st_mode);
}